

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollarea.cpp
# Opt level: O1

void __thiscall QScrollArea::setWidget(QScrollArea *this,QWidget *widget)

{
  QScrollAreaPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  Data *pDVar3;
  QWidget *pQVar4;
  QObject *pQVar5;
  long in_FS_OFFSET;
  QSize local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QScrollAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pDVar1 = (this_00->widget).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar4 = (QWidget *)0x0;
  }
  else {
    pQVar4 = (QWidget *)(this_00->widget).wp.value;
  }
  if ((widget != (QWidget *)0x0) && (pQVar4 != widget)) {
    if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
      pQVar5 = (QObject *)0x0;
    }
    else {
      pQVar5 = (this_00->widget).wp.value;
    }
    if (pQVar5 != (QObject *)0x0) {
      (**(code **)(*(long *)pQVar5 + 0x20))();
    }
    pDVar1 = (this_00->widget).wp.d;
    (this_00->widget).wp.d = (Data *)0x0;
    (this_00->widget).wp.value = (QObject *)0x0;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    QAbstractSlider::setValue
              (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0);
    QAbstractSlider::setValue
              (&((this_00->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0);
    pQVar4 = (this_00->super_QAbstractScrollAreaPrivate).viewport;
    if (*(QWidget **)(*(long *)&widget->field_0x8 + 0x10) != pQVar4) {
      QWidget::setParent(widget,pQVar4);
    }
    bVar2 = QWidget::testAttribute_helper(widget,WA_Resized);
    if (!bVar2) {
      local_30 = (QSize)(**(code **)(*(long *)widget + 0x70))(widget);
      QWidget::resize(widget,&local_30);
    }
    pDVar3 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&widget->super_QObject);
    pDVar1 = (this_00->widget).wp.d;
    (this_00->widget).wp.d = pDVar3;
    (this_00->widget).wp.value = &widget->super_QObject;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    QWidget::setAutoFillBackground((QWidget *)(this_00->widget).wp.value,true);
    QObject::installEventFilter(&widget->super_QObject);
    (this_00->widgetSize).wd = -1;
    (this_00->widgetSize).ht = -1;
    QScrollAreaPrivate::updateScrollBars(this_00);
    QWidget::show((QWidget *)(this_00->widget).wp.value);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QScrollArea::setWidget(QWidget *widget)
{
    Q_D(QScrollArea);
    if (widget == d->widget || !widget)
        return;

    delete d->widget;
    d->widget = nullptr;
    d->hbar->setValue(0);
    d->vbar->setValue(0);
    if (widget->parentWidget() != d->viewport)
        widget->setParent(d->viewport);
    if (!widget->testAttribute(Qt::WA_Resized))
        widget->resize(widget->sizeHint());
    d->widget = widget;
    d->widget->setAutoFillBackground(true);
    widget->installEventFilter(this);
    d->widgetSize = QSize();
    d->updateScrollBars();
    d->widget->show();

}